

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

OPJ_BOOL opj_mct_encode_custom
                   (OPJ_BYTE *pCodingdata,OPJ_UINT32 n,OPJ_BYTE **pData,OPJ_UINT32 pNbComp,
                   OPJ_UINT32 isSigned)

{
  OPJ_BYTE *pOVar1;
  OPJ_INT32 OVar2;
  void *ptr;
  OPJ_INT32 *pOVar3;
  OPJ_INT32 *local_70;
  OPJ_INT32 *lMctPtr;
  OPJ_UINT32 lMultiplicator;
  OPJ_INT32 **lData;
  OPJ_INT32 *lCurrentMatrix;
  OPJ_INT32 *lCurrentData;
  OPJ_UINT32 lNbMatCoeff;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_FLOAT32 *lMct;
  OPJ_UINT32 isSigned_local;
  OPJ_UINT32 pNbComp_local;
  OPJ_BYTE **pData_local;
  OPJ_UINT32 n_local;
  OPJ_BYTE *pCodingdata_local;
  
  ptr = opj_malloc((ulong)(pNbComp + pNbComp * pNbComp) << 2);
  if (ptr == (void *)0x0) {
    pCodingdata_local._4_4_ = 0;
  }
  else {
    pOVar3 = (OPJ_INT32 *)((long)ptr + (ulong)pNbComp * 4);
    _j = (float *)pCodingdata;
    for (k = 0; k < pNbComp * pNbComp; k = k + 1) {
      pOVar3[k] = (int)(*_j * 8192.0);
      _j = _j + 1;
    }
    for (k = 0; k < n; k = k + 1) {
      for (lNbMatCoeff = 0; lNbMatCoeff < pNbComp; lNbMatCoeff = lNbMatCoeff + 1) {
        *(undefined4 *)((long)ptr + (ulong)lNbMatCoeff * 4) = *(undefined4 *)pData[lNbMatCoeff];
      }
      local_70 = pOVar3;
      for (lNbMatCoeff = 0; lNbMatCoeff < pNbComp; lNbMatCoeff = lNbMatCoeff + 1) {
        pOVar1 = pData[lNbMatCoeff];
        pOVar1[0] = '\0';
        pOVar1[1] = '\0';
        pOVar1[2] = '\0';
        pOVar1[3] = '\0';
        for (lCurrentData._4_4_ = 0; lCurrentData._4_4_ < pNbComp;
            lCurrentData._4_4_ = lCurrentData._4_4_ + 1) {
          OVar2 = opj_int_fix_mul(*local_70,
                                  *(OPJ_INT32 *)((long)ptr + (ulong)lCurrentData._4_4_ * 4));
          *(OPJ_INT32 *)pData[lNbMatCoeff] = OVar2 + *(int *)pData[lNbMatCoeff];
          local_70 = local_70 + 1;
        }
        pData[lNbMatCoeff] = pData[lNbMatCoeff] + 4;
      }
    }
    opj_free(ptr);
    pCodingdata_local._4_4_ = 1;
  }
  return pCodingdata_local._4_4_;
}

Assistant:

OPJ_BOOL opj_mct_encode_custom(
					   OPJ_BYTE * pCodingdata,
					   OPJ_UINT32 n,
					   OPJ_BYTE ** pData,
					   OPJ_UINT32 pNbComp,
					   OPJ_UINT32 isSigned)
{
	OPJ_FLOAT32 * lMct = (OPJ_FLOAT32 *) pCodingdata;
	OPJ_UINT32 i;
	OPJ_UINT32 j;
	OPJ_UINT32 k;
	OPJ_UINT32 lNbMatCoeff = pNbComp * pNbComp;
	OPJ_INT32 * lCurrentData = 00;
	OPJ_INT32 * lCurrentMatrix = 00;
	OPJ_INT32 ** lData = (OPJ_INT32 **) pData;
	OPJ_UINT32 lMultiplicator = 1 << 13;
	OPJ_INT32 * lMctPtr;

    OPJ_ARG_NOT_USED(isSigned);

	lCurrentData = (OPJ_INT32 *) opj_malloc((pNbComp + lNbMatCoeff) * sizeof(OPJ_INT32));
	if (! lCurrentData) {
		return OPJ_FALSE;
	}

	lCurrentMatrix = lCurrentData + pNbComp;

	for (i =0;i<lNbMatCoeff;++i) {
		lCurrentMatrix[i] = (OPJ_INT32) (*(lMct++) * (OPJ_FLOAT32)lMultiplicator);
	}

	for (i = 0; i < n; ++i)  {
		lMctPtr = lCurrentMatrix;
		for (j=0;j<pNbComp;++j) {
			lCurrentData[j] = (*(lData[j]));
		}

		for (j=0;j<pNbComp;++j) {
			*(lData[j]) = 0;
			for (k=0;k<pNbComp;++k) {
				*(lData[j]) += opj_int_fix_mul(*lMctPtr, lCurrentData[k]);
				++lMctPtr;
			}

			++lData[j];
		}
	}

	opj_free(lCurrentData);

	return OPJ_TRUE;
}